

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_ManPrintRefs(Fraig_Man_t *pMan)

{
  Fraig_Node_t *pFVar1;
  Fraig_Node_t *pNode2_00;
  int iVar2;
  Fraig_NodeVec_t *p;
  abctime clk;
  int nProved;
  int Counter;
  int k;
  int i;
  Fraig_Node_t *pNode2;
  Fraig_Node_t *pNode;
  Fraig_NodeVec_t *vPivots;
  Fraig_Man_t *pMan_local;
  
  p = Fraig_NodeVecAlloc(1000);
  for (Counter = 0; Counter < pMan->vNodes->nSize; Counter = Counter + 1) {
    pFVar1 = pMan->vNodes->pArray[Counter];
    if (((*(uint *)&pFVar1->field_0x18 >> 0xc != 0) &&
        (*(uint *)&pFVar1->field_0x18 >> 0xc != pMan->nWordsRand << 5)) && (5 < pFVar1->nRefs)) {
      Fraig_NodeVecPush(p,pFVar1);
    }
  }
  printf("Total nodes = %d. Referenced nodes = %d.\n",(ulong)(uint)pMan->vNodes->nSize,
         (ulong)(uint)p->nSize);
  Abc_Clock();
  clk._0_4_ = 0;
  clk._4_4_ = 0;
  for (Counter = 0; nProved = Counter, Counter < p->nSize; Counter = Counter + 1) {
    while (nProved = nProved + 1, nProved < p->nSize) {
      pFVar1 = p->pArray[Counter];
      pNode2_00 = p->pArray[nProved];
      iVar2 = Fraig_NodeSimsContained(pMan,pFVar1,pNode2_00);
      if (iVar2 == 0) {
        iVar2 = Fraig_NodeSimsContained(pMan,pNode2_00,pFVar1);
        if (iVar2 != 0) {
          iVar2 = Fraig_NodeIsImplication(pMan,pNode2_00,pFVar1,-1);
          if (iVar2 != 0) {
            clk._0_4_ = (uint)clk + 1;
          }
          clk._4_4_ = clk._4_4_ + 1;
        }
      }
      else {
        iVar2 = Fraig_NodeIsImplication(pMan,pFVar1,pNode2_00,-1);
        if (iVar2 != 0) {
          clk._0_4_ = (uint)clk + 1;
        }
        clk._4_4_ = clk._4_4_ + 1;
      }
    }
  }
  printf("Number of candidate pairs = %d.  Proved = %d.\n",(ulong)clk._4_4_,(ulong)(uint)clk);
  return 0;
}

Assistant:

int Fraig_ManPrintRefs( Fraig_Man_t * pMan )
{
    Fraig_NodeVec_t * vPivots;
    Fraig_Node_t * pNode, * pNode2;
    int i, k, Counter, nProved;
    abctime clk;

    vPivots = Fraig_NodeVecAlloc( 1000 );
    for ( i = 0; i < pMan->vNodes->nSize; i++ )
    {
        pNode = pMan->vNodes->pArray[i];

        if ( pNode->nOnes == 0 || pNode->nOnes == (unsigned)pMan->nWordsRand * 32 )
            continue;

        if ( pNode->nRefs > 5 )
        {
            Fraig_NodeVecPush( vPivots, pNode );
//            printf( "Node %6d : nRefs = %2d   Level = %3d.\n", pNode->Num, pNode->nRefs, pNode->Level );
        }
    }
    printf( "Total nodes = %d. Referenced nodes = %d.\n", pMan->vNodes->nSize, vPivots->nSize );

clk = Abc_Clock();
    // count implications
    Counter = nProved = 0;
    for ( i = 0; i < vPivots->nSize; i++ )
        for ( k = i+1; k < vPivots->nSize; k++ )
        {
            pNode  = vPivots->pArray[i];
            pNode2 = vPivots->pArray[k];
            if ( Fraig_NodeSimsContained( pMan, pNode, pNode2 ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode, pNode2, -1 ) )
                    nProved++;
                Counter++;
            }
            else if ( Fraig_NodeSimsContained( pMan, pNode2, pNode ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode2, pNode, -1 ) )
                    nProved++;
                Counter++;
            }
        }
    printf( "Number of candidate pairs = %d.  Proved = %d.\n", Counter, nProved );
//ABC_PRT( "Time", Abc_Clock() - clk );
    return 0;
}